

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_soft.c
# Opt level: O0

void shader_grad_any_first(uintptr_t state,int x1,int y,int left_minor,int left_major)

{
  float fVar1;
  float fVar2;
  float cur_y;
  float cur_x;
  state_grad_any_2d *s;
  int left_major_local;
  int left_minor_local;
  int y_local;
  int x1_local;
  uintptr_t state_local;
  
  fVar1 = (float)x1 - *(float *)(state + 0x68);
  fVar2 = (float)y - *(float *)(state + 0x6c);
  *(float *)(state + 8) =
       fVar1 * *(float *)(state + 0x18) + fVar2 * *(float *)(state + 0x28) +
       *(float *)(state + 0x38);
  *(float *)(state + 0xc) =
       fVar1 * *(float *)(state + 0x1c) + fVar2 * *(float *)(state + 0x2c) +
       *(float *)(state + 0x3c);
  *(float *)(state + 0x10) =
       fVar1 * *(float *)(state + 0x20) + fVar2 * *(float *)(state + 0x30) +
       *(float *)(state + 0x40);
  *(float *)(state + 0x14) =
       fVar1 * *(float *)(state + 0x24) + fVar2 * *(float *)(state + 0x34) +
       *(float *)(state + 0x44);
  *(float *)(state + 0x48) = (float)left_minor * *(float *)(state + 0x18) + *(float *)(state + 0x28)
  ;
  *(float *)(state + 0x4c) = (float)left_minor * *(float *)(state + 0x1c) + *(float *)(state + 0x2c)
  ;
  *(float *)(state + 0x50) = (float)left_minor * *(float *)(state + 0x20) + *(float *)(state + 0x30)
  ;
  *(float *)(state + 0x54) = (float)left_minor * *(float *)(state + 0x24) + *(float *)(state + 0x34)
  ;
  *(float *)(state + 0x58) = (float)left_major * *(float *)(state + 0x18) + *(float *)(state + 0x28)
  ;
  *(float *)(state + 0x5c) = (float)left_major * *(float *)(state + 0x1c) + *(float *)(state + 0x2c)
  ;
  *(float *)(state + 0x60) = (float)left_major * *(float *)(state + 0x20) + *(float *)(state + 0x30)
  ;
  *(float *)(state + 100) = (float)left_major * *(float *)(state + 0x24) + *(float *)(state + 0x34);
  return;
}

Assistant:

static void shader_grad_any_first(uintptr_t state, int x1, int y, int left_minor, int left_major)
{
   state_grad_any_2d* s = (state_grad_any_2d*)state;

   const float cur_x = (float)x1 - s->off_x;
   const float cur_y = (float)y - s->off_y;

   s->solid.cur_color.r = cur_x * s->color_dx.r + cur_y * s->color_dy.r + s->color_const.r;
   s->solid.cur_color.g = cur_x * s->color_dx.g + cur_y * s->color_dy.g + s->color_const.g;
   s->solid.cur_color.b = cur_x * s->color_dx.b + cur_y * s->color_dy.b + s->color_const.b;
   s->solid.cur_color.a = cur_x * s->color_dx.a + cur_y * s->color_dy.a + s->color_const.a;

   s->minor_color.r = (float)left_minor * s->color_dx.r + s->color_dy.r;
   s->minor_color.g = (float)left_minor * s->color_dx.g + s->color_dy.g;
   s->minor_color.b = (float)left_minor * s->color_dx.b + s->color_dy.b;
   s->minor_color.a = (float)left_minor * s->color_dx.a + s->color_dy.a;

   s->major_color.r = (float)left_major * s->color_dx.r + s->color_dy.r;
   s->major_color.g = (float)left_major * s->color_dx.g + s->color_dy.g;
   s->major_color.b = (float)left_major * s->color_dx.b + s->color_dy.b;
   s->major_color.a = (float)left_major * s->color_dx.a + s->color_dy.a;
}